

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqdebug.cpp
# Opt level: O0

void __thiscall SQVM::Raise_CompareError(SQVM *this,SQObject *o1,SQObject *o2)

{
  SQString *pSVar1;
  SQObject *in_RDX;
  SQObject *in_RSI;
  SQVM *in_RDI;
  SQObjectPtr oval2;
  SQObjectPtr oval1;
  SQObjectValue in_stack_ffffffffffffffa0;
  SQVM *in_stack_ffffffffffffffa8;
  SQObjectValue local_50;
  SQObjectPtr local_38;
  SQObjectPtr local_28;
  SQObject *local_18;
  
  local_18 = in_RDX;
  ::SQObjectPtr::SQObjectPtr(&local_38,in_RSI);
  pSVar1 = PrintObjVal(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0.pString);
  ::SQObjectPtr::SQObjectPtr(&local_28,pSVar1);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff98,local_18);
  pSVar1 = PrintObjVal(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0.pString);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa8,pSVar1);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  Raise_Error(in_RDI,"comparison between \'%.50s\' and \'%.50s\'",
              &(local_28.super_SQObject._unVal.pTable)->_firstfree,&(local_50.pTable)->_firstfree);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_RDI);
  return;
}

Assistant:

void SQVM::Raise_CompareError(const SQObject &o1, const SQObject &o2)
{
    SQObjectPtr oval1 = PrintObjVal(o1), oval2 = PrintObjVal(o2);
    Raise_Error(_SC("comparison between '%.50s' and '%.50s'"), _stringval(oval1), _stringval(oval2));
}